

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeUnbind(Vdbe *p,uint i)

{
  Mem *p_00;
  sqlite3_mutex *psVar1;
  sqlite3 *psVar2;
  uint uVar3;
  undefined8 uVar4;
  char *zFormat;
  
  if (p == (Vdbe *)0x0) {
    zFormat = "API called with NULL prepared statement";
  }
  else {
    if (p->db != (sqlite3 *)0x0) {
      psVar1 = p->db->mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar1);
      }
      if (p->eVdbeState == '\x01') {
        if ((uint)(int)p->nVar <= i) {
          psVar2 = p->db;
          psVar2->errCode = 0x19;
          sqlite3ErrorFinish(psVar2,0x19);
          psVar1 = p->db->mutex;
          if (psVar1 == (sqlite3_mutex *)0x0) {
            return 0x19;
          }
          (*sqlite3Config.mutex.xMutexLeave)(psVar1);
          return 0x19;
        }
        p_00 = p->aVar + i;
        if (((p->aVar[i].flags & 0x9000) != 0) || (p_00->szMalloc != 0)) {
          vdbeMemClear(p_00);
        }
        p_00->flags = 1;
        p->db->errCode = 0;
        if (p->expmask == 0) {
          return 0;
        }
        uVar3 = 0x80000000;
        if (i < 0x1f) {
          uVar3 = 1 << ((byte)i & 0x1f);
        }
        if ((p->expmask & uVar3) == 0) {
          return 0;
        }
        p->field_0xc6 = (p->field_0xc6 & 0xfc) + 1;
        return 0;
      }
      psVar2 = p->db;
      psVar2->errCode = 0x15;
      sqlite3ErrorFinish(psVar2,0x15);
      psVar1 = p->db->mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar1);
      }
      sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
      uVar4 = 0x15a82;
      goto LAB_0013ac26;
    }
    zFormat = "API called with finalized prepared statement";
  }
  sqlite3_log(0x15,zFormat);
  uVar4 = 0x15a7a;
LAB_0013ac26:
  sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",uVar4,
              "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  return 0x15;
}

Assistant:

static int vdbeUnbind(Vdbe *p, unsigned int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->eVdbeState!=VDBE_READY_STATE ){
    sqlite3Error(p->db, SQLITE_MISUSE);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE,
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i>=(unsigned int)p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  p->db->errCode = SQLITE_OK;

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-57496-20354 If the specific value bound to a host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask!=0 && (p->expmask & (i>=31 ? 0x80000000 : (u32)1<<i))!=0 ){
    p->expired = 1;
  }
  return SQLITE_OK;
}